

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

bool __thiscall
soplex::SPxSolverBase<double>::isTimeLimitReached(SPxSolverBase<double> *this,bool forceCheck)

{
  double dVar1;
  int iVar2;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  
  this->nCallsToTimelim = this->nCallsToTimelim + 1;
  dVar1 = this->maxTime;
  ::soplex::infinity::__tls_init();
  if (dVar1 < *(double *)(in_FS_OFFSET + -8)) {
    if (((forceCheck) || (this->nCallsToTimelim < 200)) || (this->nClckSkipsLeft < 1)) {
      (*this->theTime->_vptr_Timer[6])();
      if (this->maxTime <= extraout_XMM0_Qa) {
        return true;
      }
      iVar2 = (uint)(32.0 <= ((this->maxTime - extraout_XMM0_Qa) * 0.01) /
                             ((this->theCumulativeTime + extraout_XMM0_Qa) /
                              (double)this->nCallsToTimelim + 1e-06)) << 5;
    }
    else {
      iVar2 = this->nClckSkipsLeft + -1;
    }
    this->nClckSkipsLeft = iVar2;
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::isTimeLimitReached(const bool forceCheck)
   {
      // always update the number of calls, since the user might set a time limit later in the solving process
      ++nCallsToTimelim;

      // check if a time limit is actually set
      if(maxTime >= R(infinity))
         return false;

      // check if the expensive system call to update the time should be skipped again
      if(forceCheck || nCallsToTimelim < SOPLEX_NINITCALLS ||  nClckSkipsLeft <= 0)
      {
         Real currtime = time();

         if(currtime >= maxTime)
            return true;

         // determine the number of times the clock can be skipped again.
         int nClckSkips = SOPLEX_MAXNCLCKSKIPS;
         Real avgtimeinterval = (currtime + cumulativeTime()) / (Real)(nCallsToTimelim);

         // it would not be safe to skip the clock so many times since we are approaching the time limit
         if(SOPLEX_SAFETYFACTOR * (maxTime - currtime) / (avgtimeinterval + 1e-6) < nClckSkips)
            nClckSkips = 0;

         nClckSkipsLeft = nClckSkips;
      }
      else
         --nClckSkipsLeft;

      return false;
   }